

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

BufferOrError * __thiscall
slang::SourceManager::openCached
          (SourceManager *this,path *fullPath,SourceLocation includedFrom,SourceLibrary *library,
          uint64_t sortKey)

{
  undefined1 *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  string *buffer_00;
  uint64_t uVar5;
  size_t sVar6;
  group_type *pgVar7;
  value_type *pvVar8;
  long lVar9;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
  *paVar10;
  pair<std::nullptr_t,_std::error_code> *args_2;
  undefined8 in_RCX;
  path *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_RSI;
  BufferOrError *in_RDI;
  SourceBuffer *in_R9;
  iterator iVar11;
  error_code eVar12;
  unexpected_type<std::error_code> uVar13;
  unique_lock<std::shared_mutex> lock_1;
  error_code ec_2;
  SmallVector<char,_40UL> buffer;
  type *ec_1;
  type *fd;
  iterator it;
  unique_lock<std::shared_mutex> lock;
  string pathStr;
  error_code ec;
  path absPath;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa58;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  *in_stack_fffffffffffffa60;
  path *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  raw_key_type *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  *args_2_00;
  undefined4 in_stack_fffffffffffffae0;
  SourceManager *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  undefined4 uVar14;
  SourceManager *library_00;
  SourceManager *this_00;
  SourceLocation includedFrom_00;
  unique_lock<std::shared_mutex> *in_stack_fffffffffffffb20;
  path *in_stack_fffffffffffffb70;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_428;
  void *local_410;
  pair<std::nullptr_t,_std::error_code> local_408;
  error_code local_3e0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  local_3d0;
  undefined8 local_390;
  SourceLibrary *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  SourceManager *in_stack_fffffffffffffca0;
  SourceLocation in_stack_fffffffffffffca8;
  undefined1 local_320 [52];
  int local_2ec;
  int local_2e8;
  error_category *local_2e0;
  path local_2c8;
  error_code local_2a0;
  path local_290;
  SourceBuffer *local_268;
  path *local_258;
  undefined8 local_248;
  undefined1 *local_238;
  uint64_t local_230;
  SourceManager *local_228;
  SourceLocation local_220;
  pair<std::nullptr_t,_std::error_code> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  long local_208;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
  local_200;
  undefined1 *local_1e8;
  uint64_t sortKey_00;
  SourceManager *buffer_01;
  SourceLocation local_1d0;
  uint local_194;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  undefined1 *local_160;
  uint64_t local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  local_148;
  pair<std::nullptr_t,_std::error_code> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  long local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
  local_b0;
  pair<std::nullptr_t,_std::error_code> *local_98;
  size_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  pair<std::nullptr_t,_std::error_code> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  pair<std::nullptr_t,_std::error_code> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  long local_8;
  
  local_268 = in_R9;
  local_258 = in_RDX;
  local_248 = in_RCX;
  std::filesystem::__cxx11::path::path((path *)in_stack_fffffffffffffa60);
  if ((*(byte *)(in_RSI + 0x14c) & 1) == 0) {
    std::error_code::error_code((error_code *)in_stack_fffffffffffffa60);
    std::filesystem::weakly_canonical(&local_2c8,(error_code *)local_258);
    std::filesystem::__cxx11::path::operator=
              (in_stack_fffffffffffffa68,(path *)in_stack_fffffffffffffa60);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
    bVar2 = std::error_code::operator_cast_to_bool(&local_2a0);
    if (bVar2) {
      uVar13 = nonstd::expected_lite::make_unexpected<std::error_code&>((error_code *)0x68c262);
      local_2e0 = uVar13.m_error._M_cat;
      local_2e8 = uVar13.m_error._M_value;
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
      expected<std::error_code,_0>
                ((expected<slang::SourceBuffer,_std::error_code> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 (unexpected_type<std::error_code> *)in_stack_fffffffffffffa68);
      local_2ec = 1;
      goto LAB_0068d048;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&local_290,local_258);
  }
  buffer_00 = getU8Str((path *)0x68c2f9);
  std::__cxx11::string::string(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffa60,
             (mutex_type *)in_stack_fffffffffffffa58);
  uVar5 = in_RSI + 0x88;
  puVar1 = local_320 + 0x10;
  local_238 = puVar1;
  local_230 = uVar5;
  local_1e8 = puVar1;
  sortKey_00 = uVar5;
  sVar6 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
          ::hash_for<std::__cxx11::string>(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  local_168 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
              ::position_for(in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
  local_170 = sVar6;
  local_160 = puVar1;
  local_158 = uVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_180,local_168);
  do {
    sVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_180);
    pgVar7 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
             ::groups((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                       *)0x68c484);
    local_194 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffa68,(size_t)in_stack_fffffffffffffa60);
    if (local_194 != 0) {
      pvVar8 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
               ::elements((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                           *)0x68c4e2);
      do {
        uVar3 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffb20 =
             (unique_lock<std::shared_mutex> *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                     *)0x68c535);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
        ::
        key_from<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>
                    *)0x68c568);
        bVar2 = std::
                equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x68c58f);
        if (bVar2) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
          ::table_locator(&local_200,pgVar7 + sVar6,uVar3,pvVar8 + sVar6 * 0xf + (ulong)uVar3);
          goto LAB_0068c684;
        }
        local_194 = local_194 - 1 & local_194;
      } while (local_194 != 0);
    }
    bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
    if (bVar2) {
      memset(&local_200,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
      ::table_locator(&local_200);
      goto LAB_0068c684;
    }
    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_180,*(size_t *)(in_RSI + 0x90));
  } while (bVar2);
  memset(&local_200,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
  ::table_locator(&local_200);
LAB_0068c684:
  iVar11 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
           ::make_iterator((locator *)0x68c695);
  buffer_01 = (SourceManager *)iVar11.pc_;
  local_1d0 = (SourceLocation)iVar11.p_;
  local_220 = local_1d0;
  library_00 = buffer_01;
  this_00 = buffer_01;
  includedFrom_00 = local_1d0;
  local_228 = buffer_01;
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
  ::end((unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
         *)0x68c739);
  bVar2 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffa60,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffa58);
  uVar14 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffaf4);
  if (bVar2) {
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  *)in_stack_fffffffffffffa60);
    std::
    get<0ul,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>
              ((pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                *)0x68c79d);
    in_stack_fffffffffffffca8 =
         (SourceLocation)
         std::
         get<1ul,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>
                   ((pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                     *)0x68c7b2);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)in_stack_fffffffffffffca8);
    if (bVar2) {
      uVar13 = nonstd::expected_lite::make_unexpected<std::error_code&>((error_code *)0x68c7dd);
      in_stack_fffffffffffffae8 = (SourceManager *)uVar13.m_error._M_cat;
      in_stack_fffffffffffffaf0 = uVar13.m_error._M_value;
      in_stack_fffffffffffffc98 = in_stack_fffffffffffffaf0;
      in_stack_fffffffffffffca0 = in_stack_fffffffffffffae8;
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
      expected<std::error_code,_0>
                ((expected<slang::SourceBuffer,_std::error_code> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 (unexpected_type<std::error_code> *)in_stack_fffffffffffffa68);
      local_2ec = 1;
    }
    else {
      std::
      unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
      ::get((unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
             *)in_stack_fffffffffffffa60);
      local_390 = local_248;
      in_stack_fffffffffffffa58 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
      createBufferEntry(this_00,(FileData *)local_1d0,includedFrom_00,(SourceLibrary *)library_00,
                        CONCAT44(uVar14,in_stack_fffffffffffffaf0),in_stack_fffffffffffffb20);
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
      expected<slang::SourceBuffer,_0>
                ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffa60,
                 (SourceBuffer *)in_stack_fffffffffffffa58);
      local_2ec = 1;
    }
  }
  else {
    local_2ec = 0;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffa60);
  if (local_2ec == 0) {
    args_2_00 = &local_3d0;
    SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x68c932);
    eVar12 = OS::readFile(in_stack_fffffffffffffb70,(SmallVector<char,_40UL> *)buffer_00);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar12._M_cat;
    iVar4 = eVar12._M_value;
    local_3e0._M_value = iVar4;
    local_3e0._M_cat = (error_category *)args_1;
    bVar2 = std::error_code::operator_cast_to_bool(&local_3e0);
    if (bVar2) {
      std::unique_lock<std::shared_mutex>::unique_lock
                ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffa60,
                 (mutex_type *)in_stack_fffffffffffffa58);
      lVar9 = in_RSI + 0x88;
      local_410 = (void *)0x0;
      std::pair<std::nullptr_t,_std::error_code>::pair<std::nullptr_t,_std::error_code_&,_true>
                (&local_408,&local_410,&local_3e0);
      local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_320 + 0x10);
      local_218 = &local_408;
      local_208 = lVar9;
      local_140 = local_218;
      local_138 = local_210;
      local_130 = lVar9;
      paVar10 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                      *)0x68ca4d);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
      ::alloc_cted_or_fwded_key_type(&local_148,paVar10,local_138);
      local_78 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
                 ::move_or_fwd(&local_148);
      local_70 = &local_149;
      local_80 = local_140;
      local_68 = lVar9;
      local_88 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                 ::key_from<std::__cxx11::string,std::pair<decltype(nullptr),std::error_code>>
                           (local_78,local_140);
      local_90 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                 ::hash_for<std::__cxx11::string>
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      args_2 = (pair<std::nullptr_t,_std::error_code> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
               ::position_for(in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
      local_10 = local_88;
      local_20 = local_90;
      local_98 = args_2;
      local_18 = args_2;
      local_8 = lVar9;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,(size_t)args_2);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                   ::groups((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                             *)0x68cba0);
        local_40 = local_40 + local_38;
        uVar3 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffa68,(size_t)in_stack_fffffffffffffa60);
        local_44 = uVar3;
        if (uVar3 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                     ::elements((table_arrays<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                                 *)0x68cbf5);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffa78 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                         *)0x68cc45);
            in_stack_fffffffffffffa80 = local_10;
            in_stack_fffffffffffffa88 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                 ::
                 key_from<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>
                             *)0x68cc72);
            bVar2 = std::
                    equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x68cc8d);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_0068cd79;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffa60,(size_t)in_stack_fffffffffffffa58);
        in_stack_fffffffffffffa74 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa74);
        if (bVar2) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
          ::table_locator(&local_b0);
          goto LAB_0068cd79;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(lVar9 + 8));
      } while (bVar2);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>
      ::table_locator(&local_b0);
LAB_0068cd79:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_b0);
      if (bVar2) {
        local_c0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                   ::make_iterator((locator *)0x68cd99);
        local_c1 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_428,&local_c0,&local_c1);
      }
      else if (*(ulong *)(in_RSI + 0xb0) < *(ulong *)(in_RSI + 0xa8)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                    *)CONCAT44(uVar3,in_stack_fffffffffffffa90),(size_t)in_stack_fffffffffffffa88,
                   (size_t)in_stack_fffffffffffffa80,(try_emplace_args_t *)in_stack_fffffffffffffa78
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),args_2);
        local_d8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                   ::make_iterator((locator *)0x68ce35);
        local_f1[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_428,&local_d8,local_f1);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                    *)CONCAT44(uVar14,in_stack_fffffffffffffaf0),(size_t)in_stack_fffffffffffffae8,
                   (try_emplace_args_t *)CONCAT44(iVar4,in_stack_fffffffffffffae0),args_1,
                   (pair<std::nullptr_t,_std::error_code> *)args_2_00);
        local_108 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>_>_>
                    ::make_iterator((locator *)0x68cead);
        local_121[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_428,&local_108,local_121);
      }
      uVar13 = nonstd::expected_lite::make_unexpected<std::error_code&>((error_code *)0x68cef5);
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
      expected<std::error_code,_0>
                ((expected<slang::SourceBuffer,_std::error_code> *)
                 CONCAT44(in_stack_fffffffffffffa74,uVar13.m_error._M_value),
                 (unexpected_type<std::error_code> *)uVar13.m_error._M_cat);
      local_2ec = 1;
      std::unique_lock<std::shared_mutex>::~unique_lock
                ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffa60);
    }
    else {
      in_stack_fffffffffffffa60 = &local_3d0;
      cacheBuffer(in_stack_fffffffffffffca0,
                  (path *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                  in_stack_fffffffffffffc90,in_stack_fffffffffffffca8,in_stack_fffffffffffffc88,
                  sortKey_00,(SmallVector<char,_40UL> *)buffer_01);
      nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::
      expected<slang::SourceBuffer,_0>
                ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffa60,
                 local_268);
      local_2ec = 1;
    }
    SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x68d019);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
LAB_0068d048:
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
  return in_RDI;
}

Assistant:

SourceManager::BufferOrError SourceManager::openCached(const fs::path& fullPath,
                                                       SourceLocation includedFrom,
                                                       const SourceLibrary* library,
                                                       uint64_t sortKey) {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(fullPath, ec);
        if (ec)
            return nonstd::make_unexpected(ec);
    }
    else {
        absPath = fullPath;
    }

    // first see if we have this file cached
    std::string pathStr = getU8Str(absPath);
    {
        std::unique_lock<std::shared_mutex> lock(mutex);
        auto it = lookupCache.find(pathStr);
        if (it != lookupCache.end()) {
            auto& [fd, ec] = it->second;
            if (ec)
                return nonstd::make_unexpected(ec);

            SLANG_ASSERT(fd);
            return createBufferEntry(fd.get(), includedFrom, library, sortKey, lock);
        }
    }

    // do the read
    SmallVector<char> buffer;
    if (std::error_code ec = OS::readFile(absPath, buffer)) {
        std::unique_lock<std::shared_mutex> lock(mutex);
        lookupCache.emplace(pathStr, std::pair{nullptr, ec});
        return nonstd::make_unexpected(ec);
    }

    return cacheBuffer(std::move(absPath), std::move(pathStr), includedFrom, library, sortKey,
                       std::move(buffer));
}